

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O1

void __thiscall
s2coding::EncodeS2PointVectorFast
          (s2coding *this,Span<const_Vector3<double>_> points,Encoder *encoder)

{
  uchar *__dest;
  Encoder *this_00;
  pointer pVVar1;
  
  this_00 = (Encoder *)points.len_;
  pVVar1 = points.ptr_;
  Encoder::Ensure(this_00,(long)pVVar1 * 0x18 + 10);
  __dest = (uchar *)Varint::Encode64((char *)this_00->buf_,(long)pVVar1 * 8);
  this_00->buf_ = __dest;
  memcpy(__dest,this,(long)pVVar1 * 0x18);
  this_00->buf_ = this_00->buf_ + (long)pVVar1 * 0x18;
  return;
}

Assistant:

void EncodeS2PointVectorFast(Span<const S2Point> points, Encoder* encoder) {
#ifndef IS_LITTLE_ENDIAN
  S2_LOG(FATAL) << "Not implemented on big-endian architectures";
#endif

  // This function always uses the UNCOMPRESSED encoding.  The header consists
  // of a varint64 in the following format:
  //
  //   bits 0-2:  encoding format (UNCOMPRESSED)
  //   bits 3-63: vector size
  //
  // This is followed by an array of S2Points in little-endian order.
  encoder->Ensure(Varint::kMax64 + points.size() * sizeof(S2Point));
  uint64 size_format = (points.size() << kEncodingFormatBits |
                        EncodedS2PointVector::UNCOMPRESSED);
  encoder->put_varint64(size_format);
  encoder->putn(points.data(), points.size() * sizeof(S2Point));
}